

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O3

int dwarf_next_cu_header_d
              (Dwarf_Debug dbg,Dwarf_Bool is_info,Dwarf_Unsigned *cu_header_length,
              Dwarf_Half *version_stamp,Dwarf_Unsigned *abbrev_offset,Dwarf_Half *address_size,
              Dwarf_Half *offset_size,Dwarf_Half *extension_size,Dwarf_Sig8 *signature,
              Dwarf_Unsigned *typeoffset,Dwarf_Unsigned *next_cu_offset,Dwarf_Half *header_cu_type,
              Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Bool local_4;
  
  iVar1 = _dwarf_next_cu_header_internal
                    (dbg,is_info,(Dwarf_Die *)0x0,cu_header_length,version_stamp,abbrev_offset,
                     address_size,offset_size,extension_size,signature,&local_4,typeoffset,
                     next_cu_offset,header_cu_type,error);
  return iVar1;
}

Assistant:

int
dwarf_next_cu_header_d(Dwarf_Debug dbg,
    Dwarf_Bool is_info,
    Dwarf_Unsigned * cu_header_length,
    Dwarf_Half * version_stamp,
    Dwarf_Unsigned * abbrev_offset,
    Dwarf_Half * address_size,
    Dwarf_Half * offset_size,
    Dwarf_Half * extension_size,
    Dwarf_Sig8 * signature,
    Dwarf_Unsigned * typeoffset,
    Dwarf_Unsigned * next_cu_offset,
    Dwarf_Half * header_cu_type,
    Dwarf_Error * error)
{
    Dwarf_Bool has_signature = FALSE;
    int res = 0;

    res = _dwarf_next_cu_header_internal(dbg,
        is_info,
        NULL,
        cu_header_length,
        version_stamp,
        abbrev_offset,
        address_size,
        offset_size,
        extension_size,
        signature,
        &has_signature,
        typeoffset,
        next_cu_offset,
        header_cu_type,
        error);
    return res;
}